

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

bool __thiscall QTableModel::removeRows(QTableModel *this,int row,int count,QModelIndex *param_3)

{
  QList<QTableWidgetItem_*> *pQVar1;
  QTableWidgetItem *pQVar2;
  Data *pDVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < row && 0 < count) {
    if ((ulong)(uint)(row + count) <= (ulong)(this->verticalHeaderItems).d.size) {
      local_50 = 0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      QAbstractItemModel::beginRemoveRows((QModelIndex *)this,(int)&local_50,row);
      uVar5 = (int)(this->horizontalHeaderItems).d.size * row;
      local_50 = 0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      iVar6 = (**(code **)(*(long *)this + 0x80))(this);
      iVar6 = iVar6 * count;
      if (0 < iVar6) {
        lVar7 = (long)(int)uVar5;
        do {
          pQVar2 = (this->tableItems).d.ptr[lVar7];
          if (pQVar2 != (QTableWidgetItem *)0x0) {
            pQVar2->view = (QTableWidget *)0x0;
            (*pQVar2->_vptr_QTableWidgetItem[1])();
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (int)(iVar6 + uVar5));
      }
      uVar8 = 0;
      if (0 < (int)uVar5) {
        uVar8 = (ulong)uVar5;
      }
      if (iVar6 != 0) {
        pQVar1 = &this->tableItems;
        pDVar3 = (pQVar1->d).d;
        if ((pDVar3 == (Data *)0x0) ||
           (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QArrayDataPointer<QTableWidgetItem_*>::reallocateAndGrow
                    (&pQVar1->d,GrowsAtEnd,0,(QArrayDataPointer<QTableWidgetItem_*> *)0x0);
        }
        QtPrivate::QPodArrayOps<QTableWidgetItem_*>::erase
                  ((QPodArrayOps<QTableWidgetItem_*> *)pQVar1,(this->tableItems).d.ptr + uVar8,
                   (long)iVar6);
      }
      pQVar1 = &this->verticalHeaderItems;
      uVar8 = (ulong)(uint)row;
      do {
        pQVar2 = (this->verticalHeaderItems).d.ptr[uVar8];
        if (pQVar2 != (QTableWidgetItem *)0x0) {
          pQVar2->view = (QTableWidget *)0x0;
          (*pQVar2->_vptr_QTableWidgetItem[1])();
        }
        uVar8 = uVar8 + 1;
      } while ((int)uVar8 < row + count);
      pDVar3 = (pQVar1->d).d;
      if ((pDVar3 == (Data *)0x0) ||
         (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QArrayDataPointer<QTableWidgetItem_*>::reallocateAndGrow
                  (&pQVar1->d,GrowsAtEnd,0,(QArrayDataPointer<QTableWidgetItem_*> *)0x0);
      }
      QtPrivate::QPodArrayOps<QTableWidgetItem_*>::erase
                ((QPodArrayOps<QTableWidgetItem_*> *)pQVar1,
                 (this->verticalHeaderItems).d.ptr + (uint)row,(ulong)(uint)count);
      QAbstractItemModel::endRemoveRows();
      bVar4 = true;
      goto LAB_00590eb1;
    }
  }
  bVar4 = false;
LAB_00590eb1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QTableModel::removeRows(int row, int count, const QModelIndex &)
{
    if (count < 1 || row < 0 || row + count > verticalHeaderItems.size())
        return false;

    beginRemoveRows(QModelIndex(), row, row + count - 1);
    int i = tableIndex(row, 0);
    int n = count * columnCount();
    QTableWidgetItem *oldItem = nullptr;
    for (int j = i; j < n + i; ++j) {
        oldItem = tableItems.at(j);
        if (oldItem)
            oldItem->view = nullptr;
        delete oldItem;
    }
    tableItems.remove(qMax(i, 0), n);
    for (int v = row; v < row + count; ++v) {
        oldItem = verticalHeaderItems.at(v);
        if (oldItem)
            oldItem->view = nullptr;
        delete oldItem;
    }
    verticalHeaderItems.remove(row, count);
    endRemoveRows();
    return true;
}